

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsdCheck.c
# Opt level: O3

int Dsd_CheckRootFunctionIdentity(DdManager *dd,DdNode *bF1,DdNode *bF2,DdNode *bC1,DdNode *bC2)

{
  Dsd_Entry_t *pDVar1;
  ulong uVar2;
  Dds_Cache_t *pDVar3;
  uint uVar4;
  int iVar5;
  DdNode **ppDVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  DdNode *pDVar10;
  DdNode *pDVar11;
  ulong uVar12;
  DdNode *g;
  DdNode **ppDVar13;
  DdNode *pDVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  DdNode *apDStack_b8 [4];
  uint auStack_98 [4];
  DdNode *apDStack_88 [4];
  DdNode *apDStack_68 [4];
  uint *apuStack_48 [5];
  
  ppDVar6 = apDStack_b8;
  pDVar14 = dd->one;
  pDVar11 = (DdNode *)((ulong)pDVar14 ^ 1);
  if (pDVar11 == bC1) {
    __assert_fail("bC1 != b0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/dsd/dsdCheck.c"
                  ,0xa0,
                  "int Dsd_CheckRootFunctionIdentity_rec(DdManager *, DdNode *, DdNode *, DdNode *, DdNode *)"
                 );
  }
  if (pDVar11 == bC2) {
    __assert_fail("bC2 != b0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/dsd/dsdCheck.c"
                  ,0xa1,
                  "int Dsd_CheckRootFunctionIdentity_rec(DdManager *, DdNode *, DdNode *, DdNode *, DdNode *)"
                 );
  }
  if (pDVar14 == bC2 && pDVar14 == bC1) {
    return (uint)(bF1 == bF2);
  }
  pDVar10 = bC2;
  if (pDVar11 == bF1) {
    g = (DdNode *)((ulong)bF2 ^ 1);
LAB_0093e420:
    iVar5 = Cudd_bddLeq(dd,pDVar10,g);
    return iVar5;
  }
  g = bF2;
  if (pDVar14 == bF1) goto LAB_0093e420;
  pDVar10 = bC1;
  if (pDVar11 == bF2) {
    g = (DdNode *)((ulong)bF1 ^ 1);
    goto LAB_0093e420;
  }
  g = bF1;
  if (pDVar14 == bF2) goto LAB_0093e420;
  pDVar1 = pCache->pTable;
  uVar8 = (ulong)(((((long)&bF1->index + (long)&bF2->index) * 0xc00005 + (long)bC1) * 0x40f1f9 +
                  (long)bC2) * 0xb5051) % (ulong)(long)pCache->nTableSize & 0xffffffff;
  if ((((pDVar1[uVar8].bX[0] == bF1) && (pDVar1[uVar8].bX[1] == bF2)) &&
      (pDVar1[uVar8].bX[2] == bC1)) && (pDVar1[uVar8].bX[3] == bC2)) {
    pCache->nSuccess = pCache->nSuccess + 1;
    return *(int *)(pDVar1[uVar8].bX + 4);
  }
  apDStack_68[0] = bF1;
  apDStack_68[1] = bF2;
  apDStack_68[2] = bC1;
  apDStack_68[3] = bC2;
  apuStack_48[0] = (uint *)((ulong)bF1 & 0xfffffffffffffffe);
  apuStack_48[1] = (uint *)((ulong)bF2 & 0xfffffffffffffffe);
  apuStack_48[2] = (uint *)((ulong)bC1 & 0xfffffffffffffffe);
  apuStack_48[3] = (uint *)((ulong)bC2 & 0xfffffffffffffffe);
  uVar12 = (ulong)*(uint *)((ulong)bF1 & 0xfffffffffffffffe);
  auStack_98[1] = 0x7fffffff;
  auStack_98[0] = 0x7fffffff;
  if (uVar12 != 0x7fffffff) {
    auStack_98[0] = dd->perm[uVar12];
  }
  uVar12 = (ulong)*(uint *)((ulong)bF2 & 0xfffffffffffffffe);
  if (uVar12 != 0x7fffffff) {
    auStack_98[1] = dd->perm[uVar12];
  }
  uVar12 = (ulong)*(uint *)((ulong)bC1 & 0xfffffffffffffffe);
  uVar4 = 0x7fffffff;
  uVar7 = 0x7fffffff;
  if (uVar12 != 0x7fffffff) {
    uVar7 = dd->perm[uVar12];
  }
  auStack_98[2] = uVar7;
  uVar12 = (ulong)*(uint *)((ulong)bC2 & 0xfffffffffffffffe);
  if (uVar12 != 0x7fffffff) {
    uVar4 = dd->perm[uVar12];
  }
  auStack_98[3] = uVar4;
  pCache->nFailure = pCache->nFailure + 1;
  uVar16 = ~-(uint)((int)auStack_98[0] < (int)uVar7) & uVar7 |
           auStack_98[0] & -(uint)((int)auStack_98[0] < (int)uVar7);
  uVar17 = ~-(uint)((int)auStack_98[1] < (int)uVar4) & uVar4 |
           auStack_98[1] & -(uint)((int)auStack_98[1] < (int)uVar4);
  uVar15 = -(uint)((int)uVar16 < (int)uVar17);
  uVar15 = ~uVar15 & uVar17 | uVar16 & uVar15;
  lVar9 = 0;
  do {
    uVar12 = *(ulong *)((long)apDStack_68 + lVar9 * 2);
    if (uVar15 == *(uint *)((long)auStack_98 + lVar9)) {
      uVar2 = *(ulong *)((long)apuStack_48 + lVar9 * 2);
      if (uVar12 == uVar2) {
        *(ulong *)((long)apDStack_88 + lVar9 * 2) = *(ulong *)(uVar2 + 0x18);
        uVar12 = *(ulong *)(uVar2 + 0x10);
        ppDVar13 = apDStack_b8;
      }
      else {
        *(ulong *)((long)apDStack_88 + lVar9 * 2) = *(ulong *)(uVar2 + 0x18) ^ 1;
        uVar12 = *(ulong *)(uVar2 + 0x10) ^ 1;
        ppDVar13 = apDStack_b8;
      }
    }
    else {
      *(ulong *)((long)apDStack_b8 + lVar9 * 2) = uVar12;
      ppDVar13 = apDStack_88;
    }
    *(ulong *)((long)ppDVar13 + lVar9 * 2) = uVar12;
    lVar9 = lVar9 + 4;
  } while (lVar9 != 0x10);
  if ((uVar15 == uVar7) && (uVar15 == uVar4)) {
    ppDVar6 = apDStack_88;
    if (apDStack_88[2] == pDVar11) {
      ppDVar6 = apDStack_b8;
      apDStack_88[2] = apDStack_b8[2];
    }
    apDStack_b8[0] = *ppDVar6;
    ppDVar6 = apDStack_88;
    if (apDStack_88[3] == pDVar11) {
      ppDVar6 = apDStack_b8;
    }
    apDStack_b8[1] = ppDVar6[1];
    if (apDStack_88[3] == pDVar11) {
      apDStack_88[3] = apDStack_b8[3];
    }
  }
  else {
    if ((uVar15 == uVar7) && (uVar15 != uVar4)) {
      pDVar14 = apDStack_b8[2];
      if (apDStack_88[2] != pDVar11) {
        ppDVar6 = apDStack_88;
        pDVar14 = apDStack_88[2];
      }
      pDVar11 = *ppDVar6;
      iVar5 = Dsd_CheckRootFunctionIdentity_rec(dd,pDVar11,apDStack_88[1],pDVar14,apDStack_88[3]);
      apDStack_b8[0] = pDVar11;
      apDStack_88[2] = pDVar14;
      apDStack_88[3] = apDStack_b8[3];
    }
    else if ((uVar15 == uVar7) || (uVar15 != uVar4)) {
      iVar5 = Dsd_CheckRootFunctionIdentity_rec
                        (dd,apDStack_88[0],apDStack_88[1],apDStack_88[2],apDStack_88[3]);
      apDStack_88[2] = apDStack_b8[2];
      apDStack_88[3] = apDStack_b8[3];
    }
    else {
      pDVar14 = apDStack_88[3];
      ppDVar6 = apDStack_88;
      if (apDStack_88[3] == pDVar11) {
        pDVar14 = apDStack_b8[3];
        ppDVar6 = apDStack_b8;
      }
      apDStack_b8[1] = ppDVar6[1];
      iVar5 = Dsd_CheckRootFunctionIdentity_rec
                        (dd,apDStack_88[0],apDStack_b8[1],apDStack_88[2],pDVar14);
      apDStack_88[2] = apDStack_b8[2];
      apDStack_88[3] = pDVar14;
    }
    if (iVar5 != 1) goto LAB_0093e3cb;
  }
  iVar5 = Dsd_CheckRootFunctionIdentity_rec
                    (dd,apDStack_b8[0],apDStack_b8[1],apDStack_88[2],apDStack_88[3]);
LAB_0093e3cb:
  pDVar3 = pCache;
  lVar9 = 0;
  do {
    pDVar3->pTable[uVar8].bX[lVar9] = apDStack_68[lVar9];
    lVar9 = lVar9 + 1;
  } while (lVar9 != 4);
  pDVar3->pTable[uVar8].bX[4] = (DdNode *)(long)iVar5;
  return iVar5;
}

Assistant:

int Dsd_CheckRootFunctionIdentity( DdManager * dd, DdNode * bF1, DdNode * bF2, DdNode * bC1, DdNode * bC2 )
{
    int RetValue;
//  pCache->nSuccess = 0;
//  pCache->nFailure = 0;
    RetValue = Dsd_CheckRootFunctionIdentity_rec(dd, bF1, bF2, bC1, bC2);
//  printf( "Cache success = %d. Cache failure = %d.\n", pCache->nSuccess, pCache->nFailure );
    return RetValue;
}